

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iterator.c
# Opt level: O1

void pnga_local_iterator_init(Integer g_a,_iterator_hdl *hdl)

{
  short sVar1;
  global_array_t *pgVar2;
  Integer IVar3;
  Integer IVar4;
  long lVar5;
  long lVar6;
  long lVar7;
  long lVar8;
  
  pgVar2 = GA;
  lVar5 = g_a + 1000;
  sVar1 = GA[lVar5].ndim;
  lVar7 = (long)sVar1;
  lVar6 = (long)GA[lVar5].p_handle;
  hdl->g_a = g_a;
  hdl->count = 0;
  hdl->oversize = 0;
  switch(pgVar2[lVar5].distr_type) {
  case 1:
    IVar3 = pnga_pgroup_nodeid(lVar6);
    hdl->count = IVar3;
    break;
  case 2:
    IVar3 = pnga_pgroup_nodeid(lVar6);
    pgVar2 = GA;
    if (0 < sVar1) {
      lVar6 = 0;
      do {
        hdl->blk_size[lVar6] = pgVar2[g_a + 1000].block_dims[lVar6];
        hdl->blk_num[lVar6] = pgVar2[g_a + 1000].num_blocks[lVar6];
        hdl->blk_inc[lVar6] = (long)pgVar2[g_a + 1000].nblock[lVar6];
        hdl->blk_dim[lVar6] = pgVar2[g_a + 1000].dims[lVar6];
        lVar6 = lVar6 + 1;
      } while (lVar7 != lVar6);
    }
    pgVar2 = GA;
    sVar1 = GA[lVar5].ndim;
    lVar6 = (long)sVar1;
    lVar5 = IVar3 % (long)GA[lVar5].nblock[0];
    hdl->proc_index[0] = lVar5;
    if (1 < lVar6) {
      lVar7 = hdl->proc_index[0];
      lVar8 = 0;
      IVar4 = IVar3;
      do {
        IVar4 = (IVar4 - lVar7) / (long)pgVar2[g_a + 1000].nblock[lVar8];
        lVar7 = IVar4 % (long)pgVar2[g_a + 1000].nblock[lVar8 + 1];
        hdl->proc_index[lVar8 + 1] = lVar7;
        lVar8 = lVar8 + 1;
      } while (lVar6 + -1 != lVar8);
    }
    hdl->index[0] = lVar5;
    if (1 < sVar1) {
      lVar5 = hdl->index[0];
      lVar7 = 0;
      do {
        IVar3 = (IVar3 - lVar5) / (long)pgVar2[g_a + 1000].nblock[lVar7];
        lVar5 = IVar3 % (long)pgVar2[g_a + 1000].nblock[lVar7 + 1];
        hdl->index[lVar7 + 1] = lVar5;
        lVar7 = lVar7 + 1;
      } while (lVar6 + -1 != lVar7);
    }
    break;
  case 3:
    IVar3 = pnga_pgroup_nodeid(lVar6);
    pgVar2 = GA;
    if (0 < sVar1) {
      lVar6 = 0;
      do {
        hdl->blk_size[lVar6] = pgVar2[g_a + 1000].block_dims[lVar6];
        hdl->blk_num[lVar6] = pgVar2[g_a + 1000].num_blocks[lVar6];
        hdl->blk_inc[lVar6] = (long)pgVar2[g_a + 1000].nblock[lVar6];
        hdl->blk_dim[lVar6] = pgVar2[g_a + 1000].dims[lVar6];
        lVar6 = lVar6 + 1;
      } while (lVar7 != lVar6);
    }
    pgVar2 = GA;
    sVar1 = GA[lVar5].ndim;
    lVar6 = (long)sVar1;
    lVar5 = IVar3 % (long)GA[lVar5].nblock[0];
    hdl->proc_index[0] = lVar5;
    if (1 < lVar6) {
      lVar7 = hdl->proc_index[0];
      lVar8 = 0;
      IVar4 = IVar3;
      do {
        IVar4 = (IVar4 - lVar7) / (long)pgVar2[g_a + 1000].nblock[lVar8];
        lVar7 = IVar4 % (long)pgVar2[g_a + 1000].nblock[lVar8 + 1];
        hdl->proc_index[lVar8 + 1] = lVar7;
        lVar8 = lVar8 + 1;
      } while (lVar6 + -1 != lVar8);
    }
    hdl->index[0] = lVar5;
    if (1 < sVar1) {
      lVar5 = hdl->index[0];
      lVar7 = 0;
      do {
        IVar3 = (IVar3 - lVar5) / (long)pgVar2[g_a + 1000].nblock[lVar7];
        lVar5 = IVar3 % (long)pgVar2[g_a + 1000].nblock[lVar7 + 1];
        hdl->index[lVar7 + 1] = lVar5;
        lVar7 = lVar7 + 1;
      } while (lVar6 + -1 != lVar7);
    }
    break;
  case 4:
    IVar3 = pnga_pgroup_nodeid(lVar6);
    pgVar2 = GA;
    hdl->mapc = GA[lVar5].mapc;
    if (0 < sVar1) {
      lVar6 = 0;
      do {
        hdl->blk_num[lVar6] = pgVar2[g_a + 1000].num_blocks[lVar6];
        hdl->blk_inc[lVar6] = (long)pgVar2[g_a + 1000].nblock[lVar6];
        hdl->blk_dim[lVar6] = pgVar2[g_a + 1000].dims[lVar6];
        lVar6 = lVar6 + 1;
      } while (lVar7 != lVar6);
    }
    sVar1 = pgVar2[lVar5].ndim;
    lVar6 = (long)sVar1;
    lVar5 = IVar3 % (long)pgVar2[lVar5].nblock[0];
    hdl->proc_index[0] = lVar5;
    if (1 < lVar6) {
      lVar7 = hdl->proc_index[0];
      lVar8 = 0;
      IVar4 = IVar3;
      do {
        IVar4 = (IVar4 - lVar7) / (long)pgVar2[g_a + 1000].nblock[lVar8];
        lVar7 = IVar4 % (long)pgVar2[g_a + 1000].nblock[lVar8 + 1];
        hdl->proc_index[lVar8 + 1] = lVar7;
        lVar8 = lVar8 + 1;
      } while (lVar6 + -1 != lVar8);
    }
    hdl->index[0] = lVar5;
    if (1 < sVar1) {
      lVar5 = hdl->index[0];
      lVar7 = 0;
      do {
        IVar3 = (IVar3 - lVar5) / (long)pgVar2[g_a + 1000].nblock[lVar7];
        lVar5 = IVar3 % (long)pgVar2[g_a + 1000].nblock[lVar7 + 1];
        hdl->index[lVar7 + 1] = lVar5;
        lVar7 = lVar7 + 1;
      } while (lVar6 + -1 != lVar7);
    }
  }
  return;
}

Assistant:

void pnga_local_iterator_init(Integer g_a, _iterator_hdl *hdl)
{
  Integer handle = GA_OFFSET + g_a;
  Integer ndim = GA[handle].ndim;
  Integer grp = (Integer)GA[handle].p_handle;
  hdl->g_a = g_a;
  hdl->count = 0;
  hdl->oversize = 0;
  /* If standard GA distribution then no additional action needs to be taken */
  if (GA[handle].distr_type == BLOCK_CYCLIC) {
    /* GA uses simple block cyclic data distribution */
    hdl->count = pnga_pgroup_nodeid(grp);
  } else if (GA[handle].distr_type == SCALAPACK) {
    /* GA uses ScaLAPACK block cyclic data distribution */
    int j;
    Integer me = pnga_pgroup_nodeid(grp);
    /* Calculate some properties associated with data distribution */
    for (j=0; j<ndim; j++)  {
      hdl->blk_size[j] = GA[handle].block_dims[j];
      hdl->blk_num[j] = GA[handle].num_blocks[j];
      hdl->blk_inc[j] = GA[handle].nblock[j];
      hdl->blk_dim[j] = GA[handle].dims[j];
    }
    /* Initialize proc_index and index arrays */
    gam_find_proc_indices(handle, me, hdl->proc_index);
    gam_find_proc_indices(handle, me, hdl->index);
  } else if (GA[handle].distr_type == TILED) {
    /* GA uses tiled distribution */
    int j;
    Integer me = pnga_pgroup_nodeid(grp);
    /* Calculate some properties associated with data distribution */
    for (j=0; j<ndim; j++)  {
      hdl->blk_size[j] = GA[handle].block_dims[j];
      hdl->blk_num[j] = GA[handle].num_blocks[j];
      hdl->blk_inc[j] = GA[handle].nblock[j];
      hdl->blk_dim[j] = GA[handle].dims[j];
    }
    /* Initialize proc_index and index arrays */
    gam_find_tile_proc_indices(handle, me, hdl->proc_index);
    gam_find_tile_proc_indices(handle, me, hdl->index);
  } else if (GA[handle].distr_type == TILED_IRREG) {
    /* GA uses irregular tiled distribution */
    int j;
    Integer me = pnga_pgroup_nodeid(grp);
    hdl->mapc = GA[handle].mapc;
    /* Calculate some properties associated with data distribution */
    for (j=0; j<ndim; j++)  {
      hdl->blk_num[j] = GA[handle].num_blocks[j];
      hdl->blk_inc[j] = GA[handle].nblock[j];
      hdl->blk_dim[j] = GA[handle].dims[j];
    }
    /* Initialize proc_index and index arrays */
    gam_find_tile_proc_indices(handle, me, hdl->proc_index);
    gam_find_tile_proc_indices(handle, me, hdl->index);
  }
}